

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
MlmWrap::getClients_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,MlmWrap *this)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  undefined8 uVar3;
  zmsg_t *msg;
  zmsg_t *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_48 = czhelp_zmsg_create("s","CLI",0);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->actormutex);
  if (iVar1 == 0) {
    zactor_send(this->actor,&local_48);
    local_48 = zactor_recv(this->actor);
    pthread_mutex_unlock((pthread_mutex_t *)&this->actormutex);
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __s = zmsg_popstr(local_48);
    while (__s != (char *)0x0) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      sVar2 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,__s,__s + sVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      free(__s);
      __s = zmsg_popstr(local_48);
    }
    zmsg_destroy(&local_48);
    return __return_storage_ptr__;
  }
  uVar3 = std::__throw_system_error(iVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(__return_storage_ptr__);
  _Unwind_Resume(uVar3);
}

Assistant:

std::vector<std::string> MlmWrap::getClients(){
    zmsg_t *msg = czhelp_zmsg_create("s", getclients, NULL);
    {
        std::lock_guard<std::mutex> lock(actormutex);
        zactor_send(actor, &msg);
        msg = zactor_recv(actor);
    }
    std::vector<std::string> clients;
    char *cl = zmsg_popstr(msg);
    while(cl){
        clients.push_back(cl);
        freen(cl);
        cl = zmsg_popstr(msg);
    }
    zmsg_destroy(&msg);
    return clients;
}